

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idamax.c
# Opt level: O0

integer idamax_(integer *n,doublereal *dx,integer *incx)

{
  double local_78;
  double local_70;
  doublereal local_68;
  double local_60;
  double local_58;
  doublereal local_50;
  int local_48;
  int local_44;
  integer ix;
  integer i;
  doublereal dmax__;
  doublereal d__1;
  integer i__1;
  integer ret_val;
  integer *incx_local;
  doublereal *dx_local;
  integer *n_local;
  
  if ((*n < 1) || (*incx < 1)) {
    n_local._4_4_ = 0;
  }
  else {
    d__1._4_4_ = 1;
    if (*n == 1) {
      n_local._4_4_ = 1;
    }
    else if (*incx == 1) {
      if (*dx < 0.0) {
        local_68 = -*dx;
      }
      else {
        local_68 = *dx;
      }
      _ix = local_68;
      for (local_44 = 2; local_44 <= *n; local_44 = local_44 + 1) {
        local_70 = dx[local_44 + -1];
        if (local_70 < 0.0) {
          local_70 = -local_70;
        }
        if (_ix < local_70) {
          d__1._4_4_ = local_44;
          local_78 = dx[local_44 + -1];
          if (local_78 < 0.0) {
            local_78 = -local_78;
          }
          _ix = local_78;
        }
      }
      n_local._4_4_ = d__1._4_4_;
    }
    else {
      if (*dx < 0.0) {
        local_50 = -*dx;
      }
      else {
        local_50 = *dx;
      }
      _ix = local_50;
      local_48 = *incx + 1;
      for (local_44 = 2; local_44 <= *n; local_44 = local_44 + 1) {
        local_58 = dx[local_48 + -1];
        if (local_58 < 0.0) {
          local_58 = -local_58;
        }
        if (_ix < local_58) {
          d__1._4_4_ = local_44;
          local_60 = dx[local_48 + -1];
          if (local_60 < 0.0) {
            local_60 = -local_60;
          }
          _ix = local_60;
        }
        local_48 = *incx + local_48;
      }
      n_local._4_4_ = d__1._4_4_;
    }
  }
  return n_local._4_4_;
}

Assistant:

integer idamax_(integer *n, doublereal *dx, integer *incx)
{


    /* System generated locals */
integer ret_val, i__1;
    doublereal d__1;

    /* Local variables */
    doublereal dmax__;
    integer i, ix;


/*     finds the index of element having max. absolute value.   
       jack dongarra, linpack, 3/11/78.   
       modified 3/93 to return if incx .le. 0.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define DX(I) dx[(I)-1]


    ret_val = 0;
    if (*n < 1 || *incx <= 0) {
	return ret_val;
    }
    ret_val = 1;
    if (*n == 1) {
	return ret_val;
    }
    if (*incx == 1) {
	goto L20;
    }

/*        code for increment not equal to 1 */

    ix = 1;
    dmax__ = abs(DX(1));
    ix += *incx;
    for (i = 2; i <= *n; ++i) {
	if ((d__1 = DX(ix), abs(d__1)) <= dmax__) {
	    goto L5;
	}
	ret_val = i;
	dmax__ = (d__1 = DX(ix), abs(d__1));
L5:
	ix += *incx;
/* L10: */
    }
    return ret_val;

/*        code for increment equal to 1 */

L20:
    dmax__ = abs(DX(1));
    for (i = 2; i <= *n; ++i) {
	if ((d__1 = DX(i), abs(d__1)) <= dmax__) {
	    goto L30;
	}
	ret_val = i;
	dmax__ = (d__1 = DX(i), abs(d__1));
L30:
	;
    }
    return ret_val;
}